

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void __thiscall
duckdb::BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::LessThan>::Insert
          (BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::LessThan> *this,
          ArenaAllocator *allocator,string_t *key,string_t *value)

{
  bool bVar1;
  data_ptr_t *ppdVar2;
  char (**ppacVar3) [4];
  pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<duckdb::string_t>_> *__last;
  idx_t iVar4;
  STORAGE_TYPE *__first;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<duckdb::string_t>_>_&,_const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<duckdb::string_t>_>_&)>
  __cmp;
  _ValueType __value;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<duckdb::string_t>_>_&,_const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<duckdb::string_t>_>_&)>
  local_b0;
  anon_union_16_2_67f50693_for_value local_a8;
  uint32_t local_98;
  data_ptr_t local_90;
  undefined1 local_88 [8];
  char (*pacStack_80) [4];
  undefined4 local_78;
  char (*local_70 [2]) [4];
  anon_union_16_2_67f50693_for_value local_60;
  uint32_t local_50;
  data_ptr_t local_48;
  anon_union_16_2_67f50693_for_value local_40;
  undefined4 local_30;
  char (*local_28) [4];
  
  if (this->size < this->capacity) {
    HeapEntry<duckdb::string_t>::Assign(&this->heap[this->size].first,allocator,key);
    HeapEntry<duckdb::string_t>::Assign(&this->heap[this->size].second,allocator,value);
    __first = this->heap;
    iVar4 = this->size;
    this->size = iVar4 + 1;
    local_b0._M_comp = Compare;
    HeapEntry<duckdb::string_t>::HeapEntry
              ((HeapEntry<duckdb::string_t> *)&local_60.pointer,&__first[iVar4].first);
    HeapEntry<duckdb::string_t>::HeapEntry
              ((HeapEntry<duckdb::string_t> *)&local_40.pointer,&__first[iVar4].second);
    if ((uint)local_60._0_4_ < 0xd) {
      ppdVar2 = &local_90;
      local_a8._0_8_ = local_60._0_8_;
      local_a8.pointer.ptr = local_60.pointer.ptr;
      local_98 = 0;
    }
    else {
      ppdVar2 = &local_48;
      local_98 = local_50;
      local_90 = local_48;
      local_a8._0_8_ = CONCAT44(*(undefined4 *)local_48,local_60.pointer.length);
      local_a8.pointer.ptr = (char *)local_48;
    }
    *ppdVar2 = (data_ptr_t)0x0;
    if ((uint)local_40._0_4_ < 0xd) {
      pacStack_80 = (char (*) [4])local_40.pointer.ptr;
      local_78 = 0;
      ppacVar3 = local_70;
    }
    else {
      ppacVar3 = &local_28;
      local_78 = local_30;
      local_70[0] = local_28;
      local_40.pointer.prefix = *local_28;
      pacStack_80 = local_28;
    }
    local_88[4] = local_40.pointer.prefix[0];
    local_88[5] = local_40.pointer.prefix[1];
    local_88[6] = local_40.pointer.prefix[2];
    local_88[7] = local_40.pointer.prefix[3];
    local_88._0_4_ = local_40.pointer.length;
    *ppacVar3 = (char (*) [4])0x0;
  }
  else {
    bVar1 = string_t::StringComparisonOperators::GreaterThan((string_t *)this->heap,key);
    if (!bVar1) {
      return;
    }
    iVar4 = this->size;
    if (1 < (long)iVar4) {
      local_60._0_8_ = Compare;
      __last = this->heap + (iVar4 - 1);
      ::std::
      __pop_heap<std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<duckdb::string_t>>*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<duckdb::string_t>>const&,std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<duckdb::string_t>>const&)>>
                (this->heap,__last,__last,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<duckdb::string_t>_>_&,_const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<duckdb::string_t>_>_&)>
                  *)&local_60.pointer);
      iVar4 = this->size;
    }
    HeapEntry<duckdb::string_t>::Assign(&this->heap[iVar4 - 1].first,allocator,key);
    HeapEntry<duckdb::string_t>::Assign(&this->heap[this->size - 1].second,allocator,value);
    __first = this->heap;
    iVar4 = this->size;
    local_b0._M_comp = Compare;
    HeapEntry<duckdb::string_t>::HeapEntry
              ((HeapEntry<duckdb::string_t> *)&local_60.pointer,&__first[iVar4 - 1].first);
    HeapEntry<duckdb::string_t>::HeapEntry
              ((HeapEntry<duckdb::string_t> *)&local_40.pointer,&__first[iVar4 - 1].second);
    if ((uint)local_60._0_4_ < 0xd) {
      ppdVar2 = &local_90;
      local_a8._0_8_ = local_60._0_8_;
      local_a8.pointer.ptr = local_60.pointer.ptr;
      local_98 = 0;
    }
    else {
      ppdVar2 = &local_48;
      local_98 = local_50;
      local_90 = local_48;
      local_a8._0_8_ = CONCAT44(*(undefined4 *)local_48,local_60.pointer.length);
      local_a8.pointer.ptr = (char *)local_48;
    }
    *ppdVar2 = (data_ptr_t)0x0;
    if ((uint)local_40._0_4_ < 0xd) {
      pacStack_80 = (char (*) [4])local_40.pointer.ptr;
      local_78 = 0;
      ppacVar3 = local_70;
    }
    else {
      ppacVar3 = &local_28;
      local_78 = local_30;
      local_70[0] = local_28;
      local_40.pointer.prefix = *local_28;
      pacStack_80 = local_28;
    }
    local_88[4] = local_40.pointer.prefix[0];
    local_88[5] = local_40.pointer.prefix[1];
    local_88[6] = local_40.pointer.prefix[2];
    local_88[7] = local_40.pointer.prefix[3];
    local_88._0_4_ = local_40.pointer.length;
    iVar4 = iVar4 - 1;
    *ppacVar3 = (char (*) [4])0x0;
  }
  ::std::
  __push_heap<std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<duckdb::string_t>>*,long,std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<duckdb::string_t>>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<duckdb::string_t>>const&,std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<duckdb::string_t>>const&)>>
            (__first,iVar4,0,
             (pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<duckdb::string_t>_> *)
             &local_a8.pointer,&local_b0);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}